

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

edata_t * extent_recycle(tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,
                        edata_t *expand_edata,size_t size,size_t alignment,_Bool zero,_Bool *commit,
                        _Bool growing_retained,_Bool guarded)

{
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  eset_t *peVar3;
  _Bool _Var4;
  int iVar5;
  extent_split_interior_result_t eVar6;
  edata_t *peVar7;
  mutex_prof_data_t *data;
  eset_t *eset;
  eset_t *peVar8;
  uint lg_max_fit;
  undefined1 growing_retained_00;
  edata_t **trail_00;
  pac_t *pac_00;
  edata_t *local_58;
  edata_t *to_leak;
  edata_t *trail;
  edata_t *lead;
  edata_t *local_38;
  
  __mutex = (pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48);
  iVar5 = pthread_mutex_trylock(__mutex);
  if (iVar5 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ecache->mtx);
    (ecache->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(ecache->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((ecache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (ecache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(ecache->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  peVar3 = &ecache->eset;
  eset = &ecache->guarded_eset;
  peVar8 = peVar3;
  if (guarded) {
    peVar8 = eset;
  }
  if (expand_edata == (edata_t *)0x0) {
    lg_max_fit = 0x40;
    if (ecache->delay_coalesce != false) {
      lg_max_fit = (uint)duckdb_je_opt_lg_extent_max_active_fit;
    }
    peVar7 = duckdb_je_eset_fit(peVar8,size,alignment,guarded,lg_max_fit);
    if (peVar7 != (edata_t *)0x0) {
LAB_01d70bd6:
      duckdb_je_eset_remove(peVar8,peVar7);
      pac_00 = pac;
      duckdb_je_emap_update_edata_state(tsdn,pac->emap,peVar7,extent_state_active);
      to_leak = (edata_t *)0x0;
      local_58 = (edata_t *)0x0;
      trail_00 = &trail;
      local_38 = peVar7;
      eVar6 = extent_split_interior
                        (tsdn,pac,ehooks,&local_38,&lead,trail_00,&to_leak,&local_58,(edata_t *)size
                         ,alignment,(size_t)pac_00);
      growing_retained_00 = SUB81(trail_00,0);
      if (eVar6 == extent_split_interior_ok) {
        if (lead != (edata_t *)0x0) {
          duckdb_je_emap_update_edata_state(tsdn,pac_00->emap,lead,ecache->state);
          peVar8 = eset;
          if (((uint)lead->e_bits >> 0x10 & 1) == 0) {
            peVar8 = peVar3;
          }
          duckdb_je_eset_insert(peVar8,lead);
        }
        if (trail != (edata_t *)0x0) {
          duckdb_je_emap_update_edata_state(tsdn,pac_00->emap,trail,ecache->state);
          if (((uint)trail->e_bits >> 0x10 & 1) == 0) {
            eset = peVar3;
          }
          duckdb_je_eset_insert(eset,trail);
        }
        peVar7 = local_38;
        (ecache->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        if (peVar7 == (edata_t *)0x0) {
          return (edata_t *)0x0;
        }
        _Var4 = duckdb_je_extent_commit_zero(tsdn,ehooks,peVar7,*commit,zero,false);
        if (_Var4) {
          duckdb_je_extent_record(tsdn,pac_00,ehooks,ecache,peVar7);
          return (edata_t *)0x0;
        }
        if ((peVar7->e_bits & 0x2000) != 0) {
          *commit = true;
          return peVar7;
        }
        return peVar7;
      }
      if (local_58 != (edata_t *)0x0) {
        duckdb_je_emap_deregister_boundary(tsdn,pac_00->emap,local_58);
      }
      peVar7 = to_leak;
      if (to_leak != (edata_t *)0x0) {
        duckdb_je_emap_deregister_boundary(tsdn,pac_00->emap,to_leak);
        (ecache->mtx).field_0.field_0.locked.repr = false;
        pthread_mutex_unlock(__mutex);
        extents_abandon_vm(tsdn,pac_00,ehooks,ecache,peVar7,(_Bool)growing_retained_00);
        iVar5 = pthread_mutex_trylock(__mutex);
        if (iVar5 != 0) {
          duckdb_je_malloc_mutex_lock_slow(&ecache->mtx);
          (ecache->mtx).field_0.field_0.locked.repr = true;
        }
        puVar1 = &(ecache->mtx).field_0.field_0.prof_data.n_lock_ops;
        *puVar1 = *puVar1 + 1;
        if ((ecache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
          (ecache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
          ppwVar2 = &(ecache->mtx).field_0.witness.link.qre_prev;
          *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
        }
      }
      (ecache->mtx).field_0.field_0.locked.repr = false;
      goto LAB_01d70ce9;
    }
  }
  else {
    peVar7 = duckdb_je_emap_try_acquire_edata_neighbor_expand
                       (tsdn,pac->emap,expand_edata,EXTENT_PAI_PAC,ecache->state);
    if (peVar7 != (edata_t *)0x0) {
      if (size <= ((peVar7->field_2).e_size_esn & 0xfffffffffffff000)) goto LAB_01d70bd6;
      duckdb_je_emap_release_edata(tsdn,pac->emap,peVar7,ecache->state);
    }
  }
  (ecache->mtx).field_0.field_0.locked.repr = false;
LAB_01d70ce9:
  pthread_mutex_unlock(__mutex);
  return (edata_t *)0x0;
}

Assistant:

static edata_t *
extent_recycle(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks, ecache_t *ecache,
    edata_t *expand_edata, size_t size, size_t alignment, bool zero,
    bool *commit, bool growing_retained, bool guarded) {
	witness_assert_depth_to_rank(tsdn_witness_tsdp_get(tsdn),
	    WITNESS_RANK_CORE, growing_retained ? 1 : 0);
	assert(!guarded || expand_edata == NULL);
	assert(!guarded || alignment <= PAGE);

	malloc_mutex_lock(tsdn, &ecache->mtx);

	edata_t *edata = extent_recycle_extract(tsdn, pac, ehooks, ecache,
	    expand_edata, size, alignment, guarded);
	if (edata == NULL) {
		malloc_mutex_unlock(tsdn, &ecache->mtx);
		return NULL;
	}

	edata = extent_recycle_split(tsdn, pac, ehooks, ecache, expand_edata,
	    size, alignment, edata, growing_retained);
	malloc_mutex_unlock(tsdn, &ecache->mtx);
	if (edata == NULL) {
		return NULL;
	}

	assert(edata_state_get(edata) == extent_state_active);
	if (extent_commit_zero(tsdn, ehooks, edata, *commit, zero,
	    growing_retained)) {
		extent_record(tsdn, pac, ehooks, ecache, edata);
		return NULL;
	}
	if (edata_committed_get(edata)) {
		/*
		 * This reverses the purpose of this variable - previously it
		 * was treated as an input parameter, now it turns into an
		 * output parameter, reporting if the edata has actually been
		 * committed.
		 */
		*commit = true;
	}
	return edata;
}